

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon,REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_INT *pRVar1;
  uint uVar2;
  int iVar3;
  void *__ptr;
  undefined8 uVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  REF_DBL *pRVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  REF_EDGE ref_edge;
  REF_EDGE local_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  double local_88;
  
  ref_node = ref_grid->node;
  iVar3 = ref_node->max;
  lVar9 = (long)iVar3;
  if (lVar9 < 0) {
    pcVar6 = "malloc radius of REF_DBL negative";
    uVar4 = 0x4da;
LAB_001cb8c0:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar4,
           "ref_recon_roundoff_limit",pcVar6);
    uVar2 = 1;
  }
  else {
    __ptr = malloc(lVar9 * 8);
    auVar15 = _DAT_002025c0;
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x4da
             ,"ref_recon_roundoff_limit","malloc radius of REF_DBL NULL");
      uVar2 = 2;
    }
    else {
      if (iVar3 != 0) {
        lVar9 = lVar9 + -1;
        auVar12._8_4_ = (int)lVar9;
        auVar12._0_8_ = lVar9;
        auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
        lVar9 = 0;
        auVar12 = auVar12 ^ _DAT_002025c0;
        auVar14 = _DAT_002025b0;
        do {
          auVar16 = auVar14 ^ auVar15;
          if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                      auVar12._4_4_ < auVar16._4_4_) & 1)) {
            *(undefined8 *)((long)__ptr + lVar9) = 0xbff0000000000000;
          }
          if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
              auVar16._12_4_ <= auVar12._12_4_) {
            *(undefined8 *)((long)__ptr + lVar9 + 8) = 0xbff0000000000000;
          }
          lVar5 = auVar14._8_8_;
          auVar14._0_8_ = auVar14._0_8_ + 2;
          auVar14._8_8_ = lVar5 + 2;
          lVar9 = lVar9 + 0x10;
        } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar9);
      }
      uVar2 = ref_edge_create(&local_b0,ref_grid);
      if (uVar2 == 0) {
        iVar3 = local_b0->n;
        if (0 < (long)iVar3) {
          pRVar1 = local_b0->e2n;
          pRVar8 = ref_node->real;
          lVar9 = 0;
          do {
            lVar7 = (long)pRVar1[lVar9 * 2];
            lVar5 = (long)pRVar1[lVar9 * 2 + 1];
            dVar13 = SQRT((pRVar8[lVar5 * 0xf + 2] - pRVar8[lVar7 * 0xf + 2]) *
                          (pRVar8[lVar5 * 0xf + 2] - pRVar8[lVar7 * 0xf + 2]) +
                          (pRVar8[lVar5 * 0xf + 1] - pRVar8[lVar7 * 0xf + 1]) *
                          (pRVar8[lVar5 * 0xf + 1] - pRVar8[lVar7 * 0xf + 1]) +
                          (pRVar8[lVar5 * 0xf] - pRVar8[lVar7 * 0xf]) *
                          (pRVar8[lVar5 * 0xf] - pRVar8[lVar7 * 0xf]));
            dVar11 = *(double *)((long)__ptr + lVar7 * 8);
            uVar10 = -(ulong)(dVar11 < 0.0);
            dVar11 = (double)(~uVar10 & (ulong)dVar11 | uVar10 & (ulong)dVar13);
            if (dVar13 <= dVar11) {
              dVar11 = dVar13;
            }
            *(double *)((long)__ptr + lVar7 * 8) = dVar11;
            dVar11 = *(double *)((long)__ptr + lVar5 * 8);
            uVar10 = -(ulong)(dVar11 < 0.0);
            dVar11 = (double)(~uVar10 & (ulong)dVar11 | uVar10 & (ulong)dVar13);
            if (dVar13 <= dVar11) {
              dVar11 = dVar13;
            }
            *(double *)((long)__ptr + lVar5 * 8) = dVar11;
            lVar9 = lVar9 + 1;
          } while (iVar3 != lVar9);
        }
        ref_edge_free(local_b0);
        iVar3 = ref_node->max;
        if (0 < iVar3) {
          lVar9 = 0;
          pRVar8 = recon;
          do {
            if (-1 < ref_node->global[lVar9]) {
              dVar11 = *(double *)((long)__ptr + lVar9 * 8);
              dVar11 = dVar11 * dVar11;
              dVar13 = dVar11 * 1e+20;
              if (dVar13 <= -dVar13) {
                dVar13 = -dVar13;
              }
              if (dVar13 <= 4e-12) {
                pcVar6 = "element with zero edge length or missing element";
                uVar4 = 0x4f1;
                goto LAB_001cb8c0;
              }
              local_a8 = 4e-12 / dVar11;
              uStack_a0 = 0;
              uVar2 = ref_matrix_diag_m(pRVar8,(REF_DBL *)local_98);
              if (uVar2 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x4f8,"ref_recon_roundoff_limit",(ulong)uVar2,"eigen decomp");
                ref_matrix_show_m(pRVar8);
                ref_node_location(ref_node,(REF_INT)lVar9);
                printf("eig_floor %e radius %e\n");
                return uVar2;
              }
              auVar15._8_8_ = local_a8;
              auVar15._0_8_ = local_a8;
              local_98 = maxpd(local_98,auVar15);
              if (local_88 <= local_a8) {
                local_88 = local_a8;
              }
              uVar2 = ref_matrix_form_m((REF_DBL *)local_98,pRVar8);
              if (uVar2 != 0) {
                pcVar6 = "re-form hess";
                uVar4 = 0x4ff;
                goto LAB_001cb893;
              }
              iVar3 = ref_node->max;
            }
            lVar9 = lVar9 + 1;
            pRVar8 = pRVar8 + 6;
          } while (lVar9 < iVar3);
        }
        free(__ptr);
        uVar2 = ref_node_ghost_dbl(ref_node,recon,6);
        if (uVar2 == 0) {
          return 0;
        }
        pcVar6 = "update ghosts";
        uVar4 = 0x503;
      }
      else {
        pcVar6 = "edges";
        uVar4 = 0x4db;
      }
LAB_001cb893:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar4
             ,"ref_recon_roundoff_limit",(ulong)uVar2,pcVar6);
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_recon_roundoff_limit(REF_DBL *recon, REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node, node0, node1, edge;
  REF_DBL *radius, dist;
  REF_DBL round_off_jitter = 1.0e-12;
  REF_DBL eig_floor;
  REF_DBL diag_system[12];
  REF_EDGE ref_edge;

  ref_malloc_init(radius, ref_node_max(ref_node), REF_DBL, -1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    dist = sqrt(
        pow(ref_node_xyz(ref_node, 0, node1) - ref_node_xyz(ref_node, 0, node0),
            2) +
        pow(ref_node_xyz(ref_node, 1, node1) - ref_node_xyz(ref_node, 1, node0),
            2) +
        pow(ref_node_xyz(ref_node, 2, node1) - ref_node_xyz(ref_node, 2, node0),
            2));
    if (radius[node0] < 0.0) radius[node0] = dist;
    radius[node0] = MIN(radius[node0], dist);
    if (radius[node1] < 0.0) radius[node1] = dist;
    radius[node1] = MIN(radius[node1], dist);
  }
  ref_edge_free(ref_edge);

  each_ref_node_valid_node(ref_node, node) {
    /* 2nd order central finite difference */
    RAS(ref_math_divisible((4 * round_off_jitter),
                           (radius[node] * radius[node])),
        "element with zero edge length or missing element");
    eig_floor = (4 * round_off_jitter) / (radius[node] * radius[node]);

    RSB(ref_matrix_diag_m(&(recon[6 * node]), diag_system), "eigen decomp", {
      ref_matrix_show_m(&(recon[6 * node]));
      ref_node_location(ref_node, node);
      printf("eig_floor %e radius %e\n", eig_floor, radius[node]);
    });
    ref_matrix_eig(diag_system, 0) =
        MAX(ref_matrix_eig(diag_system, 0), eig_floor);
    ref_matrix_eig(diag_system, 1) =
        MAX(ref_matrix_eig(diag_system, 1), eig_floor);
    ref_matrix_eig(diag_system, 2) =
        MAX(ref_matrix_eig(diag_system, 2), eig_floor);
    RSS(ref_matrix_form_m(diag_system, &(recon[6 * node])), "re-form hess");
  }
  ref_free(radius);

  RSS(ref_node_ghost_dbl(ref_node, recon, 6), "update ghosts");

  return REF_SUCCESS;
}